

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Combine<duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,ArgMinMaxState<duckdb::string_t,_int> *source,
          ArgMinMaxState<duckdb::string_t,_int> *target,AggregateInputData *param_3)

{
  string_t new_value;
  
  if ((*this == (ArgMinMaxBase<duckdb::LessThan,true>)0x1) &&
     (((source->super_ArgMinMaxStateBase).is_initialized != true ||
      (*(int *)(this + 0x18) < source->value)))) {
    new_value.value.pointer.ptr = (char *)param_3;
    new_value.value._0_8_ = *(undefined8 *)(this + 0x10);
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&source->arg,*(string_t **)(this + 8),new_value);
    source->value = *(BY_TYPE *)(this + 0x18);
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}